

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O1

uintmax_t __thiscall
pstack::Procman::ExpressionStack::eval
          (ExpressionStack *this,Process *proc,Attribute *attr,StackFrame *frame,Addr reloc)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  string lle;
  Off OVar3;
  element_type *peVar4;
  undefined1 auVar5 [8];
  ulong uVar6;
  long *plVar7;
  string *psVar8;
  long lVar9;
  string *psVar10;
  intmax_t iVar11;
  intmax_t iVar12;
  uintmax_t uVar13;
  Reader *pRVar14;
  Exception *pEVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  Addr AVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 local_2d8 [8];
  Attribute unitLow;
  DIE local_2a8;
  undefined1 local_280 [8];
  DWARFReader r;
  long *local_d0;
  element_type *peStack_c8;
  long *local_c0;
  element_type *peStack_b8;
  long *local_b0;
  element_type *peStack_a8;
  undefined1 local_a0 [8];
  ProcessLocation loc;
  unsigned_long local_70;
  uint64_t base;
  Process *local_60;
  undefined1 local_58 [8];
  DWARFReader r_1;
  
  p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(attr + 0x18);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(attr + 0x20);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  lVar9 = *(long *)&p_Var16[0xc]._M_use_count;
  base = (uint64_t)frame;
  local_60 = proc;
  StackFrame::scopeIP((ProcessLocation *)local_a0,frame,proc);
  auVar5 = local_a0;
  pstack::Dwarf::Unit::root();
  pstack::Dwarf::DIE::attribute((AttrName)local_2d8,SUB81(&local_2a8,0));
  uVar6 = pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_2d8);
  local_70 = uVar6 + reloc;
  iVar1 = **(int **)(attr + 0x28);
  if (1 < iVar1 - 9U) {
    if (iVar1 == 0x17) {
      psVar8 = *(string **)(lVar9 + 0x10);
      local_280 = (undefined1  [8])&r.end;
      loc.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var16;
      if (*(ushort *)&p_Var16[0xf]._vptr__Sp_counted_base < 5) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_280,".debug_loc","");
        pstack::Elf::Object::getDebugSection(psVar8,(uint)local_280);
        if (local_280 != (undefined1  [8])&r.end) {
          operator_delete((void *)local_280,r.end + 1);
        }
        pstack::Elf::Section::io();
        local_280 = (undefined1  [8])
                    pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long(attr);
        r.off = (**(code **)(*local_c0 + 0x40))();
        r.end = (Off)local_c0;
        r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peStack_b8;
        r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 8;
        do {
          iVar11 = Dwarf::DWARFReader::getint((DWARFReader *)local_280,8);
          iVar12 = Dwarf::DWARFReader::getint((DWARFReader *)local_280,8);
          if (iVar12 == 0 && iVar11 == 0) {
            bVar2 = false;
            psVar8 = (string *)0x0;
          }
          else {
            uVar13 = Dwarf::DWARFReader::getuint((DWARFReader *)local_280,2);
            peVar4 = r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            OVar3 = r.end;
            if ((ulong)auVar5 < iVar12 + local_70 && iVar11 + local_70 <= (ulong)auVar5) {
              if (r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)(r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 8) =
                       *(int *)(r.io.
                                super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)(r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 8) =
                       *(int *)(r.io.
                                super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 8) + 1;
                }
              }
              pRVar14 = (Reader *)((long)local_280 + (uVar13 & 0xffffffff));
              local_58 = local_280;
              if (pRVar14 == (Reader *)0xffffffffffffffff) {
                pRVar14 = (Reader *)(**(code **)(*(long *)r.end + 0x40))(r.end);
              }
              r_1.end = OVar3;
              r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   peVar4;
              r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._0_4_ = 8;
              if (loc.location_ == 0) {
                AVar17 = 0;
              }
              else {
                AVar17 = (long)local_a0 - *(long *)loc.location_;
              }
              r_1.off = (Off)pRVar14;
              psVar8 = (string *)
                       eval(this,local_60,(DWARFReader *)local_58,(StackFrame *)base,AVar17);
              if (r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           r_1.io.
                           super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              bVar2 = false;
            }
            else {
              local_280 = (undefined1  [8])((long)local_280 + uVar13);
              bVar2 = true;
            }
          }
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
        } while (bVar2);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_280,".debug_loclists","");
        pstack::Elf::Object::getDebugSection(psVar8,(uint)local_280);
        if (local_280 != (undefined1  [8])&r.end) {
          operator_delete((void *)local_280,r.end + 1);
        }
        local_280 = (undefined1  [8])&r.end;
        psVar10 = *(string **)(lVar9 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_280,".debug_addr","");
        pstack::Elf::Object::getDebugSection(psVar10,(uint)local_280);
        if (local_280 != (undefined1  [8])&r.end) {
          operator_delete((void *)local_280,r.end + 1);
        }
        pstack::Elf::Section::io();
        local_58 = (undefined1  [8])
                   pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long(attr);
        r_1.off = (**(code **)(*local_d0 + 0x40))();
        r_1.end = (Off)local_d0;
        r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peStack_c8;
        r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._0_4_ = 8;
        do {
          Reader::readObj<unsigned_char>((Reader *)r_1.end,(Off)local_58,local_280,1);
          local_58 = (undefined1  [8])((long)local_58 + 1);
          lle = local_280[0];
          psVar8 = (string *)((ulong)local_280 & 0xff);
          switch(psVar8) {
          case (string *)0x0:
            bVar2 = false;
            goto LAB_0012efc8;
          case (string *)0x1:
            auVar19 = (**(code **)(*(long *)r_1.end + 0x18))();
            local_58 = (undefined1  [8])((long)local_58 + auVar19._8_8_);
            pstack::Elf::Section::io();
            Reader::readObj<unsigned_long>
                      ((Reader *)local_280,
                       auVar19._0_8_ *
                       (ulong)*(byte *)&loc.codeloc.
                                        super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi[0x10]._vptr__Sp_counted_base,&local_70,1)
            ;
            if (r.off != 0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)r.off);
            }
            break;
          default:
            pEVar15 = (Exception *)__cxa_allocate_exception(0x1a0);
            memset((Exception *)local_280,0,0x1a0);
            Exception::Exception((Exception *)local_280);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&r,"unhandled DW_LLE_",0x11);
            Procman::operator<<((ostream *)&r,(DW_LLE)lle);
            Exception::Exception(pEVar15,(Exception *)local_280);
            __cxa_throw(pEVar15,&Exception::typeinfo,Exception::~Exception);
          case (string *)0x4:
            auVar19 = (**(code **)(*(long *)r_1.end + 0x18))();
            local_58 = (undefined1  [8])((long)local_58 + auVar19._8_8_);
            auVar20 = (**(code **)(*(long *)r_1.end + 0x18))(r_1.end,local_58);
            local_58 = (undefined1  [8])((long)local_58 + auVar20._8_8_);
            auVar21 = (**(code **)(*(long *)r_1.end + 0x18))(r_1.end,local_58);
            peVar4 = r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            OVar3 = r_1.end;
            lVar9 = auVar21._0_8_;
            local_58 = (undefined1  [8])((long)local_58 + auVar21._8_8_);
            uVar6 = auVar19._0_8_ + local_70;
            bVar18 = auVar20._0_8_ + local_70 <= (ulong)auVar5;
            bVar2 = bVar18 || (ulong)auVar5 < uVar6;
            if (bVar18 || (ulong)auVar5 < uVar6) goto LAB_0012ee04;
            if (r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 8) =
                     *(int *)(r_1.io.
                              super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 8) =
                     *(int *)(r_1.io.
                              super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8) + 1;
              }
            }
            pRVar14 = (Reader *)((long)local_58 + lVar9);
            local_280 = local_58;
            if (pRVar14 == (Reader *)0xffffffffffffffff) {
              pRVar14 = (Reader *)(**(code **)(*(long *)r_1.end + 0x40))(r_1.end);
            }
            r.end = OVar3;
            r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar4;
            r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._0_4_ = 8;
            if (loc.location_ == 0) {
              AVar17 = 0;
            }
            else {
              AVar17 = (long)local_a0 - *(long *)loc.location_;
            }
            r.off = (Off)pRVar14;
            psVar10 = (string *)
                      eval(this,local_60,(DWARFReader *)local_280,(StackFrame *)base,AVar17);
LAB_0012efa9:
            if (r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            goto LAB_0012efbd;
          case (string *)0x6:
            uVar13 = Dwarf::DWARFReader::getuint
                               ((DWARFReader *)local_58,
                                (ulong)*(byte *)&loc.codeloc.
                                                 super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi[0x10]._vptr__Sp_counted_base);
            local_70 = uVar13 + reloc;
            break;
          case (string *)0x8:
            uVar13 = Dwarf::DWARFReader::getuint
                               ((DWARFReader *)local_58,
                                (ulong)*(byte *)&loc.codeloc.
                                                 super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi[0x10]._vptr__Sp_counted_base);
            auVar19 = (**(code **)(*(long *)r_1.end + 0x18))(r_1.end,local_58);
            local_58 = (undefined1  [8])((long)local_58 + auVar19._8_8_);
            auVar20 = (**(code **)(*(long *)r_1.end + 0x18))(r_1.end,local_58);
            peVar4 = r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            OVar3 = r_1.end;
            lVar9 = auVar20._0_8_;
            local_58 = (undefined1  [8])((long)local_58 + auVar20._8_8_);
            uVar6 = uVar13 + local_70;
            bVar18 = uVar6 + auVar19._0_8_ <= (ulong)auVar5;
            bVar2 = bVar18 || (ulong)auVar5 < uVar6;
            if (!bVar18 && (ulong)auVar5 >= uVar6) {
              if (r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)(r_1.io.
                           super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 8) =
                       *(int *)(r_1.io.
                                super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)(r_1.io.
                           super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 8) =
                       *(int *)(r_1.io.
                                super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 8) + 1;
                }
              }
              pRVar14 = (Reader *)((long)local_58 + lVar9);
              local_280 = local_58;
              if (pRVar14 == (Reader *)0xffffffffffffffff) {
                pRVar14 = (Reader *)(**(code **)(*(long *)r_1.end + 0x40))(r_1.end);
              }
              r.end = OVar3;
              r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   peVar4;
              r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ = 8;
              if (loc.location_ == 0) {
                AVar17 = 0;
              }
              else {
                AVar17 = (long)local_a0 - *(long *)loc.location_;
              }
              r.off = (Off)pRVar14;
              psVar10 = (string *)
                        eval(this,local_60,(DWARFReader *)local_280,(StackFrame *)base,AVar17);
              goto LAB_0012efa9;
            }
LAB_0012ee04:
            local_58 = (undefined1  [8])((long)local_58 + lVar9);
LAB_0012efbd:
            if (bVar2) break;
            bVar2 = false;
            psVar8 = psVar10;
            goto LAB_0012efc8;
          }
          bVar2 = true;
          psVar8 = psVar10;
LAB_0012efc8:
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    r_1.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          psVar10 = psVar8;
        } while (bVar2);
      }
      goto LAB_0012eb48;
    }
    if (iVar1 != 0x18) {
      pEVar15 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset((Exception *)local_280,0,0x1a0);
      Exception::Exception((Exception *)local_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&r,"unhandled attribute form ",0x19);
      std::ostream::operator<<(&r,**(int **)(attr + 0x28));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&r," evaluating expression",0x16);
      Exception::Exception(pEVar15,(Exception *)local_280);
      __cxa_throw(pEVar15,&Exception::typeinfo,Exception::~Exception);
    }
  }
  plVar7 = (long *)pstack::Dwarf::DIE::Attribute::value();
  pRVar14 = *(Reader **)*plVar7;
  uVar6 = ((ulong *)*plVar7)[1];
  pstack::Elf::Section::io();
  r.off = (Off)(pRVar14 + uVar6);
  local_280 = (undefined1  [8])pRVar14;
  if ((Reader *)r.off == (Reader *)0xffffffffffffffff) {
    r.off = (**(code **)(*local_b0 + 0x40))();
  }
  r.end = (Off)local_b0;
  r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_a8;
  r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
       = 8;
  psVar8 = (string *)eval(this,local_60,(DWARFReader *)local_280,(StackFrame *)base,reloc);
  p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_0012eb48:
  if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
  }
  Dwarf::DIE::~DIE((DIE *)local_2d8);
  Dwarf::DIE::~DIE(&local_2a8);
  if (loc.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               loc.codeloc.
               super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (uintmax_t)psVar8;
}

Assistant:

uintmax_t
ExpressionStack::eval(Process &proc, const Dwarf::DIE::Attribute &attr,
                      const StackFrame *frame, Elf::Addr reloc)
{
    Dwarf::Unit::sptr unit = attr.die.getUnit();
    const Dwarf::Info *dwarf = unit->dwarf;
    auto loc = frame->scopeIP(proc);
    auto ip = loc.location();

    const auto &unitEntry = unit->root();
    auto unitLow = unitEntry.attribute(Dwarf::DW_AT_low_pc);

    // default base address is relocation of the object + base of unit.
    uint64_t base = reloc + uintmax_t(unitLow);

    switch (attr.form()) {
        case Dwarf::DW_FORM_sec_offset:
            if (unit->version >= 5) {
                // For dwarf 5, this will be a debug_loclists entry.
                const Elf::Section &sec = dwarf->elf->getDebugSection(".debug_loclists", SHT_NULL);
                const Elf::Section &addrsec = dwarf->elf->getDebugSection(".debug_addr", SHT_NULL);
                Dwarf::DWARFReader r(sec.io(), uintmax_t(attr));
                for (;;) {
                    auto lle = DW_LLE(r.getu8());
                    switch (lle) {
                        case DW_LLE_end_of_list:
                            return 0; // failed to find a loclist for the given IP.

                        case DW_LLE_offset_pair:
                        {
                            auto start = r.getuleb128();
                            auto end = r.getuleb128();
                            auto len = r.getuleb128();
                            if (base + start <= ip && ip < base + end) {
                                Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + len);
                               return eval(proc, exr, frame, loc.elfReloc());
                            }
                            r.skip(len);
                            break;
                        }

                        case DW_LLE_base_address:
                            base = reloc + r.getuint(unit->addrlen);
                            break;

                        case DW_LLE_base_addressx:
                            {
                            auto idx = r.getuleb128();
                            addrsec.io()->readObj(idx * unit->addrlen, &base);
                            }
                            break;

                        case DW_LLE_start_length: {
                            auto start = r.getuint(unit->addrlen);
                            auto end = start + r.getuleb128();
                            auto len = r.getuleb128();
                            if (base + start <= ip && ip < base + end) {
                                Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + len);
                               return eval(proc, exr, frame, loc.elfReloc());
                            }
                            r.skip(len);
                            break;
                        }
                        default:
                            throw (Exception() << "unhandled DW_LLE_" << lle);
                    }
                }
            } else {
                // For dwarf 4, this will be a debug_loc entry.
                auto &sec = dwarf->elf->getDebugSection(".debug_loc", SHT_NULL);

                // convert this object-relative addr to a unit-relative one
                Dwarf::DWARFReader r(sec.io(), uintmax_t(attr));
                for (;;) {
                    Elf::Addr start = r.getint(sizeof start);
                    Elf::Addr end = r.getint(sizeof end);
                    if (start == 0 && end == 0)
                        return 0;
                    auto len = r.getuint(2);
                    if (ip >= base + start && ip < base + end) {
                        Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + Elf::Word(len));
                        return eval(proc, exr, frame, loc.elfReloc());
                    }
                    r.skip(len);
                }
            }
            throw (Exception() << ".debug_loc search failed");

        case Dwarf::DW_FORM_block1:
        case Dwarf::DW_FORM_block:
        case Dwarf::DW_FORM_exprloc: {
            const auto &block = Dwarf::Block(attr);
            Dwarf::DWARFReader r(dwarf->debugInfo.io(), block.offset, block.offset + block.length);
            return eval(proc, r, frame, reloc);
        }
        default:
            throw (Exception() << "unhandled attribute form " << attr.form() << " evaluating expression");
    }
}